

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O1

void __thiscall Blip_Impulse_::fine_volume_unit(Blip_Impulse_ *this)

{
  imp_t *piVar1;
  int iVar2;
  long lVar3;
  imp_t *imp_in;
  imp_t temp [1536];
  imp_t local_c18 [1540];
  
  scale_impulse(this,(uint)(ushort)this->offset << ((byte)this->fine_bits & 0x1f),local_c18);
  imp_in = this->impulses + (long)this->width * (long)this->res * 2;
  scale_impulse(this,(uint)(ushort)this->offset,imp_in);
  iVar2 = ((uint)(this->res - (this->res >> 0x1f)) >> 1) * this->width * 2;
  if (iVar2 != 0) {
    piVar1 = this->impulses;
    lVar3 = 0;
    do {
      piVar1[lVar3 * 4] = imp_in[lVar3 * 2];
      piVar1[lVar3 * 4 + 1] = imp_in[lVar3 * 2 + 1];
      *(undefined4 *)(piVar1 + lVar3 * 4 + 2) = *(undefined4 *)(local_c18 + lVar3 * 2);
      lVar3 = lVar3 + 1;
    } while (iVar2 != (int)lVar3);
  }
  return;
}

Assistant:

void Blip_Impulse_::fine_volume_unit()
{
	// to do: find way of merging in-place without temporary buffer
	
	imp_t temp [max_res * 2 * Blip_Buffer::widest_impulse_];
	scale_impulse( (offset & 0xffff) << fine_bits, temp );
	imp_t* imp2 = impulses + res * 2 * width;
	scale_impulse( offset & 0xffff, imp2 );
	
	// merge impulses
	imp_t* imp = impulses;
	imp_t* src2 = temp;
	for ( int n = res / 2 * 2 * width; n--; ) {
		*imp++ = *imp2++;
		*imp++ = *imp2++;
		*imp++ = *src2++;
		*imp++ = *src2++;
	}
}